

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

int __thiscall OpenSSLWrapper::SslConnection::SSLDoHandshake(SslConnection *this)

{
  int iVar1;
  
  std::mutex::lock(&this->m_mxSsl);
  iVar1 = SSL_do_handshake((SSL *)this->m_ssl);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxSsl);
  return iVar1;
}

Assistant:

int SslConnection::SSLDoHandshake()
    {
        lock_guard<mutex> lk(m_mxSsl);
        return SSL_do_handshake(m_ssl);
    }